

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AVLTree.cpp
# Opt level: O1

void __thiscall itis::AVLTree<short>::clear(AVLTree<short> *this)

{
  AVLTreeNode<short> *__args;
  iterator __position;
  vector<itis::AVLTreeNode<short>_*,_std::allocator<itis::AVLTreeNode<short>_*>_> stack;
  AVLTreeNode<short> **local_38;
  iterator iStack_30;
  AVLTreeNode<short> **local_28;
  
  local_38 = (AVLTreeNode<short> **)0x0;
  iStack_30._M_current = (AVLTreeNode<short> **)0x0;
  local_28 = (AVLTreeNode<short> **)0x0;
  if (this->root != (AVLTreeNode<short> *)0x0) {
    std::vector<itis::AVLTreeNode<short>*,std::allocator<itis::AVLTreeNode<short>*>>::
    _M_realloc_insert<itis::AVLTreeNode<short>*const&>
              ((vector<itis::AVLTreeNode<short>*,std::allocator<itis::AVLTreeNode<short>*>> *)
               &local_38,(iterator)0x0,&this->root);
  }
  if (local_38 != iStack_30._M_current) {
    do {
      __args = iStack_30._M_current[-1];
      __position._M_current = iStack_30._M_current + -1;
      if (__args->left != (AVLTreeNode<short> *)0x0) {
        if (__position._M_current == local_28) {
          iStack_30._M_current = __position._M_current;
          std::vector<itis::AVLTreeNode<short>*,std::allocator<itis::AVLTreeNode<short>*>>::
          _M_realloc_insert<itis::AVLTreeNode<short>*const&>
                    ((vector<itis::AVLTreeNode<short>*,std::allocator<itis::AVLTreeNode<short>*>> *)
                     &local_38,__position,&__args->left);
          __position._M_current = iStack_30._M_current;
        }
        else {
          *__position._M_current = __args->left;
          __position._M_current = iStack_30._M_current;
        }
      }
      iStack_30._M_current = __position._M_current;
      if (__args->right != (AVLTreeNode<short> *)0x0) {
        if (iStack_30._M_current == local_28) {
          std::vector<itis::AVLTreeNode<short>*,std::allocator<itis::AVLTreeNode<short>*>>::
          _M_realloc_insert<itis::AVLTreeNode<short>*const&>
                    ((vector<itis::AVLTreeNode<short>*,std::allocator<itis::AVLTreeNode<short>*>> *)
                     &local_38,iStack_30,&__args->right);
        }
        else {
          *iStack_30._M_current = __args->right;
          iStack_30._M_current = iStack_30._M_current + 1;
        }
      }
      this->_size = this->_size + -1;
      operator_delete(__args,0x20);
    } while (local_38 != iStack_30._M_current);
  }
  this->root = (AVLTreeNode<short> *)0x0;
  if (local_38 != (AVLTreeNode<short> **)0x0) {
    operator_delete(local_38,(long)local_28 - (long)local_38);
  }
  return;
}

Assistant:

void AVLTree<T>::clear() {
    std::vector<AVLTreeNode<T> *> stack;

    if (root != nullptr) {
      stack.push_back(root);
    }

    while (!stack.empty()) {
      AVLTreeNode<T> *node = stack.back();
      stack.pop_back();

      if (node->left != nullptr) {
        stack.push_back(node->left);
      }

      if (node->right != nullptr) {
        stack.push_back(node->right);
      }

      _size--;
      delete node;
    }

    root = nullptr;
  }